

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SetString
          (Reflection *this,Message *message,FieldDescriptor *field,Cord *value)

{
  byte bVar1;
  bool bVar2;
  CppStringType CVar3;
  uint32_t uVar4;
  OneofDescriptor *pOVar5;
  Cord *pCVar6;
  Cord **ppCVar7;
  string *dst;
  Nullable<const_char_*> failure_msg;
  ArenaStringPtr *pAVar8;
  char *description;
  Arena *pAVar9;
  Descriptor *pDVar10;
  Metadata MVar11;
  string local_68;
  uint32_t *local_48;
  InlinedStringField *local_40;
  uint local_34;
  
  MVar11 = Message::GetMetadata(message);
  if (MVar11.reflection != this) {
    pDVar10 = this->descriptor_;
    MVar11 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar10,MVar11.descriptor,field,"SetString");
  }
  pDVar10 = this->descriptor_;
  if (field->containing_type_ == pDVar10) {
    bVar2 = FieldDescriptor::is_repeated(field);
    if (!bVar2) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"SetString",CPPTYPE_STRING);
      }
      if ((field->field_0x1 & 8) == 0) {
        CVar3 = FieldDescriptor::cpp_string_type(field);
        if ((CVar3 == kView) || (CVar3 == kString)) {
          bVar2 = internal::ReflectionSchema::IsFieldInlined(&this->schema_,field);
          if (bVar2) {
            local_40 = MutableField<google::protobuf::internal::InlinedStringField>
                                 (this,message,field);
            uVar4 = internal::ReflectionSchema::InlinedStringIndex(&this->schema_,field);
            local_34 = 0;
            local_68._M_dataplus._M_p._0_4_ = uVar4;
            failure_msg = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_int,unsigned_int>
                                    ((uint *)&local_68,&local_34,"index > 0u");
            if (failure_msg != (Nullable<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_68,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                         ,0x84d,failure_msg);
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                        ((LogMessageFatal *)&local_68);
            }
            local_48 = MutableInlinedStringDonatedArray(this,message);
            bVar1 = (byte)uVar4 & 0x1f;
            absl::lts_20250127::Cord::operator_cast_to_string(&local_68,value);
            pAVar9 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
            if (((ulong)pAVar9 & 1) != 0) {
              pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
            }
            bVar2 = IsInlinedStringDonated(this,message,field);
            internal::InlinedStringField::Set
                      (local_40,&local_68,pAVar9,bVar2,local_48 + (uVar4 >> 5),
                       -2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1,&message->super_MessageLite);
          }
          else {
            pOVar5 = FieldDescriptor::real_containing_oneof(field);
            if (pOVar5 != (OneofDescriptor *)0x0) {
              bVar2 = HasOneofField(this,message,field);
              if (!bVar2) {
                pOVar5 = FieldDescriptor::containing_oneof(field);
                ClearOneof(this,message,pOVar5);
                pAVar8 = MutableField<google::protobuf::internal::ArenaStringPtr>
                                   (this,message,field);
                (pAVar8->tagged_ptr_).ptr_ = &internal::fixed_address_empty_string;
              }
            }
            pAVar8 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
            absl::lts_20250127::Cord::operator_cast_to_string(&local_68,value);
            pAVar9 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
            if (((ulong)pAVar9 & 1) != 0) {
              pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
            }
            internal::ArenaStringPtr::Set(pAVar8,&local_68,pAVar9);
          }
          std::__cxx11::string::~string((string *)&local_68);
        }
        else if (CVar3 == kCord) {
          pOVar5 = FieldDescriptor::real_containing_oneof(field);
          if (pOVar5 == (OneofDescriptor *)0x0) {
            pCVar6 = MutableField<absl::lts_20250127::Cord>(this,message,field);
          }
          else {
            bVar2 = HasOneofField(this,message,field);
            if (!bVar2) {
              pOVar5 = FieldDescriptor::containing_oneof(field);
              ClearOneof(this,message,pOVar5);
              pAVar9 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
              if (((ulong)pAVar9 & 1) != 0) {
                pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
              }
              pCVar6 = Arena::Create<absl::lts_20250127::Cord>(pAVar9);
              ppCVar7 = MutableField<absl::lts_20250127::Cord*>(this,message,field);
              *ppCVar7 = pCVar6;
            }
            ppCVar7 = MutableField<absl::lts_20250127::Cord*>(this,message,field);
            pCVar6 = *ppCVar7;
          }
          absl::lts_20250127::Cord::InlineRep::operator=(&pCVar6->contents_,&value->contents_);
          return;
        }
        return;
      }
      uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
      dst = internal::ExtensionSet::MutableString_abi_cxx11_
                      ((ExtensionSet *)
                       ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
                       field->number_,field->type_,field);
      absl::lts_20250127::CopyCordToString(value,dst);
      return;
    }
    pDVar10 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar10,field,"SetString",description);
}

Assistant:

void Reflection::SetString(Message* message, const FieldDescriptor* field,
                           const absl::Cord& value) const {
  USAGE_MUTABLE_CHECK_ALL(SetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return absl::CopyCordToString(value,
                                  MutableExtensionSet(message)->MutableString(
                                      field->number(), field->type(), field));
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          if (!HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            *MutableField<absl::Cord*>(message, field) =
                Arena::Create<absl::Cord>(message->GetArena());
          }
          *(*MutableField<absl::Cord*>(message, field)) = value;
        } else {
          *MutableField<absl::Cord>(message, field) = value;
        }
        break;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString: {
        if (IsInlined(field)) {
          auto* str = MutableField<InlinedStringField>(message, field);
          const uint32_t index = schema_.InlinedStringIndex(field);
          ABSL_DCHECK_GT(index, 0u);
          uint32_t* states =
              &MutableInlinedStringDonatedArray(message)[index / 32];
          uint32_t mask = ~(static_cast<uint32_t>(1) << (index % 32));
          str->Set(std::string(value), message->GetArena(),
                   IsInlinedStringDonated(*message, field), states, mask,
                   message);
        } else if (IsMicroString(field)) {
          if (schema_.InRealOneof(field) && !HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            MutableField<MicroString>(message, field)->InitDefault();
          }
          auto* str = MutableField<MicroString>(message, field);
          str->Set(std::string(value), message->GetArena());
        } else {
          if (schema_.InRealOneof(field) && !HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            MutableField<ArenaStringPtr>(message, field)->InitDefault();
          }
          auto* str = MutableField<ArenaStringPtr>(message, field);
          str->Set(std::string(value), message->GetArena());
        }
        break;
      }
    }
  }
}